

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t intersect_uint16_cardinality(uint16_t *A,size_t lenA,uint16_t *B,size_t lenB)

{
  uint16_t *endB;
  uint16_t *endA;
  int32_t answer;
  size_t lenB_local;
  uint16_t *B_local;
  size_t lenA_local;
  uint16_t *A_local;
  int32_t local_4;
  
  answer = 0;
  if ((lenA == 0) || (lenB == 0)) {
    local_4 = 0;
  }
  else {
    B_local = B;
    A_local = A;
    do {
      while (*B_local <= *A_local) {
        while (*B_local < *A_local) {
          B_local = B_local + 1;
          if (B_local == B + lenB) {
            return answer;
          }
        }
        if (*A_local != *B_local) break;
        answer = answer + 1;
        A_local = A_local + 1;
        if (A_local == A + lenA) {
          return answer;
        }
        B_local = B_local + 1;
        if (B_local == B + lenB) {
          return answer;
        }
      }
      A_local = A_local + 1;
    } while (A_local != A + lenA);
    local_4 = answer;
  }
  return local_4;
}

Assistant:

int32_t intersect_uint16_cardinality(const uint16_t *A, const size_t lenA,
                                     const uint16_t *B, const size_t lenB) {
    int32_t answer = 0;
    if (lenA == 0 || lenB == 0) return 0;
    const uint16_t *endA = A + lenA;
    const uint16_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return answer;
        }
        while (*A > *B) {
            if (++B == endB) return answer;
        }
        if (*A == *B) {
            ++answer;
            if (++A == endA || ++B == endB) return answer;
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    // return answer;  // NOTREACHED
}